

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_flac_init_internal(ma_decoding_backend_config *pConfig,ma_flac *pFlac)

{
  ma_format mVar1;
  
  if (pFlac != (ma_flac *)0x0) {
    pFlac->pReadSeekTellUserData = (void *)0x0;
    *(undefined8 *)&pFlac->format = 0;
    pFlac->onSeek = (ma_seek_proc)0x0;
    pFlac->onTell = (ma_tell_proc)0x0;
    *(undefined8 *)&(pFlac->ds).isLooping = 0;
    pFlac->onRead = (ma_read_proc)0x0;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    (pFlac->ds).loopEndInFrames = 0;
    (pFlac->ds).pCurrent = (ma_data_source *)0x0;
    pFlac->dr = (ma_dr_flac *)0x0;
    (pFlac->ds).rangeEndInFrames = 0;
    (pFlac->ds).loopBegInFrames = 0;
    (pFlac->ds).vtable = (ma_data_source_vtable *)0x0;
    (pFlac->ds).rangeBegInFrames = 0;
    pFlac->format = ma_format_f32;
    if (((pConfig != (ma_decoding_backend_config *)0x0) &&
        (mVar1 = pConfig->preferredFormat, mVar1 < ma_format_count)) &&
       ((0x34U >> (mVar1 & 0x1f) & 1) != 0)) {
      pFlac->format = mVar1;
    }
    (pFlac->ds).rangeBegInFrames = 0;
    (pFlac->ds).rangeEndInFrames = 0;
    (pFlac->ds).loopBegInFrames = 0;
    (pFlac->ds).loopEndInFrames = 0;
    (pFlac->ds).pCurrent = (ma_data_source *)0x0;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pFlac->ds).isLooping = 0;
    (pFlac->ds).vtable = &g_ma_flac_ds_vtable;
    (pFlac->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pFlac->ds).loopEndInFrames = 0xffffffffffffffff;
    (pFlac->ds).pCurrent = pFlac;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

static ma_result ma_flac_init_internal(const ma_decoding_backend_config* pConfig, ma_flac* pFlac)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pFlac == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFlac);
    pFlac->format = ma_format_f32;    /* f32 by default. */

    if (pConfig != NULL && (pConfig->preferredFormat == ma_format_f32 || pConfig->preferredFormat == ma_format_s16 || pConfig->preferredFormat == ma_format_s32)) {
        pFlac->format = pConfig->preferredFormat;
    } else {
        /* Getting here means something other than f32 and s16 was specified. Just leave this unset to use the default format. */
    }

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_flac_ds_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pFlac->ds);
    if (result != MA_SUCCESS) {
        return result;  /* Failed to initialize the base data source. */
    }

    return MA_SUCCESS;
}